

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_linear.hpp
# Opt level: O0

vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_> *
sisl::tp_linear::get_integer_support<3>(void)

{
  Index *this;
  bool bVar1;
  Scalar *pSVar2;
  reference other;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  *in_RDI;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_f0;
  value_type local_d8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_c8;
  value_type local_b0;
  undefined1 local_a0 [8];
  Matrix<int,__1,_1,_0,__1,_1> l;
  iterator __end3;
  iterator __begin3;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  *__range3;
  int i;
  lattice_site po;
  int local_4c;
  undefined1 local_48 [8];
  lattice_site zero;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  tret;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  *ret;
  
  (in_RDI->
  super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::vector(in_RDI);
  zero.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::vector((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
            *)&zero.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  local_4c = 3;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<int,__1,_1,_0,__1,_1> *)local_48,&local_4c);
  __range3._4_4_ = 3;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<int,__1,_1,_0,__1,_1> *)&i,(int *)((long)&__range3 + 4));
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_48);
  Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&i);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::push_back((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
               *)&zero.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
              (value_type *)local_48);
  for (__range3._0_4_ = 0; (int)__range3 < 3; __range3._0_4_ = (int)__range3 + 1) {
    std::
    vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
    ::clear(in_RDI);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&i,
                        (long)(int)__range3);
    *pSVar2 = 1;
    this = &zero.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    __end3 = std::
             vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
             ::begin((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                      *)this);
    l.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)std::
                vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
                ::end((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                       *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_*,_std::vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
                                       *)&l.
                                          super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows), bVar1) {
      other = __gnu_cxx::
              __normal_iterator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_*,_std::vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>_>
              ::operator*(&__end3);
      Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_a0,other);
      Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                (&local_c8,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_a0,
                 (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&i);
      Eigen::Matrix<int,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((Matrix<int,_1,1,0,_1,1> *)&local_b0,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_c8);
      std::
      vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
      ::push_back(in_RDI,&local_b0);
      Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_b0);
      std::
      vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
      ::push_back(in_RDI,(value_type *)local_a0);
      Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator-
                (&local_f0,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_a0,
                 (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&i);
      Eigen::Matrix<int,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((Matrix<int,_1,1,0,_1,1> *)&local_d8,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_f0);
      std::
      vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
      ::push_back(in_RDI,&local_d8);
      Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_d8);
      Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_a0);
      __gnu_cxx::
      __normal_iterator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_*,_std::vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>_>
      ::operator++(&__end3);
    }
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&i,
                        (long)(int)__range3);
    *pSVar2 = 0;
    std::
    vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
    ::operator=((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                 *)&zero.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows,in_RDI);
  }
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&i);
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_48);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
             *)&zero.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  return in_RDI;
}

Assistant:

static std::vector<lattice_site> get_integer_support() {
            // Poor man's cartesian product :x
            std::vector<lattice_site> ret = {}, tret = {};
            lattice_site zero(N), po(N);
            zero.setZero();
            po.setZero();
            tret.push_back(zero);

            for(int i = 0; i < N; i++) {
                ret.clear();
                po[i] = 1;
                for(auto l : tret) {
                    ret.push_back(l + po);
                    ret.push_back(l);
                    ret.push_back(l - po);
                }
                po[i] = 0;
                tret = ret;
            }
            return ret;
        }